

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

int PriorityComparator(AttVal *one,AttVal *two,ctmbstr *list)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = indexof(one->attribute,list);
  uVar2 = indexof(two->attribute,list);
  if ((int)(uVar1 | uVar2) < 0) {
    uVar3 = 0xffffffff;
    if ((int)uVar1 < 0 || uVar2 != 0xffffffff) {
      uVar3 = (uint)(uVar1 == 0xffffffff && -1 < (int)uVar2);
    }
  }
  else {
    uVar3 = -(uint)(uVar1 < uVar2) | 1;
  }
  return uVar3;
}

Assistant:

static
int PriorityComparator(AttVal *one, AttVal *two, ctmbstr *list)
{
    int oneIndex = indexof( one->attribute, list );
    int twoIndex = indexof( two->attribute, list );

    /* If both on the list, the lower index has priority. */
    if ( oneIndex >= 0 && twoIndex >= 0 )
        return oneIndex < twoIndex ? -1 : 1;

    /* If A on the list but B not on the list, then A has priority. */
    if ( oneIndex >= 0 && twoIndex == -1 )
        return -1;

    /* If A not on the list but B is on the list, then B has priority. */
    if ( oneIndex == -1 && twoIndex >= 0 )
        return 1;

    /* Otherwise nothing is on the list, so just mark them as the same. */
    return 0;
}